

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_matrix.cpp
# Opt level: O1

Reals Omega_h::repeat_matrix<2>(LO n,Tensor<2> m)

{
  Vector<4> v;
  double *pdVar1;
  undefined8 *puVar2;
  long lVar3;
  undefined4 in_register_0000003c;
  long lVar4;
  bool bVar5;
  Reals RVar6;
  Reals RVar7;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  double dStack_30;
  double local_28;
  double dStack_20;
  double local_18;
  double dStack_10;
  
  RVar7.write_.shared_alloc_.alloc._4_4_ = in_register_0000003c;
  RVar7.write_.shared_alloc_.alloc._0_4_ = n;
  pdVar1 = &local_28;
  local_18 = m.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[0];
  dStack_10 = m.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[1];
  local_28 = m.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[0];
  dStack_20 = m.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[1];
  puVar2 = &local_48;
  lVar3 = 0;
  do {
    lVar4 = 0;
    do {
      *(undefined8 *)((long)puVar2 + lVar4) = *(undefined8 *)((long)pdVar1 + lVar4 * 2);
      lVar4 = lVar4 + 8;
    } while (lVar4 == 8);
    pdVar1 = pdVar1 + 1;
    puVar2 = puVar2 + 2;
    bVar5 = lVar3 == 0;
    lVar3 = lVar3 + 1;
  } while (bVar5);
  v.super_Few<double,_4>.array_[1] = (double)uStack_40;
  v.super_Few<double,_4>.array_[0] = (double)local_48;
  v.super_Few<double,_4>.array_[2] = (double)local_38;
  v.super_Few<double,_4>.array_[3] = dStack_30;
  RVar6 = repeat_vector<4>(n,v);
  RVar7.write_.shared_alloc_.direct_ptr = RVar6.write_.shared_alloc_.direct_ptr;
  return (Reals)RVar7.write_.shared_alloc_;
}

Assistant:

Reals repeat_matrix(LO const n, Tensor<dim> const m) {
  return repeat_vector(n, matrix2vector(m));
}